

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O1

bool __thiscall ON_WindowsBitmap::ReadCompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *this_00;
  bool bVar1;
  uint uVar2;
  ON_WindowsBITMAPINFO *pOVar3;
  uint uVar4;
  char *sFormat;
  int iVar5;
  unsigned_short uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bFailedCRC;
  int i;
  short s;
  size_t sizeof_buffer;
  bool local_71;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  unsigned_short local_5a;
  ulong local_58;
  uint local_4c;
  size_t local_48;
  ON_WindowsBitmap *local_40;
  ON_BinaryArchive *local_38;
  
  local_40 = this;
  Internal_Destroy(this);
  local_71 = false;
  local_6c = 0;
  local_5a = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
  local_38 = file;
  if ((bVar1) &&
     (bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c), uVar11 = local_6c, bVar1)) {
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
    if (bVar1) {
      local_70 = local_6c;
      bVar1 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_5a);
      if (bVar1) {
        local_68 = (uint)local_5a;
        bVar1 = ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_5a);
        uVar6 = local_5a;
        uVar9 = 0;
        if (bVar1) {
          bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
          if (bVar1) {
            local_64 = local_6c;
            bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
            uVar4 = local_6c;
            if (bVar1) {
              local_60 = uVar11;
              bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
              uVar11 = local_60;
              if (bVar1) {
                local_58 = CONCAT44(local_58._4_4_,local_6c);
                bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
                if (bVar1) {
                  local_4c = local_6c;
                  bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
                  uVar10 = local_6c;
                  if (bVar1) {
                    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_6c);
                    uVar7 = 0;
                    if (bVar1) {
                      uVar7 = local_6c;
                    }
                  }
                  else {
                    uVar10 = uVar9;
                    uVar7 = 0;
                  }
                  uVar11 = local_60;
                  uVar9 = uVar10;
                  iVar5 = (int)local_58;
                  uVar10 = local_4c;
                }
                else {
                  uVar7 = 0;
                  uVar10 = 0;
                  uVar11 = local_60;
                  uVar9 = 0;
                  iVar5 = (int)local_58;
                }
                goto LAB_003ddd13;
              }
            }
            else {
              uVar4 = 0;
            }
            uVar10 = 0;
            uVar7 = 0;
            iVar5 = 0;
            goto LAB_003ddd13;
          }
        }
        else {
          uVar6 = 0;
        }
        uVar10 = 0;
        local_64 = 0;
        uVar4 = 0;
        uVar7 = 0;
        iVar5 = 0;
      }
      else {
        uVar6 = 0;
        local_64 = 0;
        uVar4 = 0;
        iVar5 = 0;
        uVar10 = 0;
        uVar9 = 0;
        uVar7 = 0;
        local_68 = 0;
      }
    }
    else {
      uVar6 = 0;
      local_64 = 0;
      uVar4 = 0;
      iVar5 = 0;
      uVar10 = 0;
      uVar9 = 0;
      uVar7 = 0;
      local_68 = 0;
      local_70 = 0;
    }
  }
  else {
    uVar6 = 0;
    local_64 = 0;
    uVar4 = 0;
    iVar5 = 0;
    uVar10 = 0;
    uVar9 = 0;
    uVar7 = 0;
    local_68 = 0;
    local_70 = 0;
    uVar11 = 0;
  }
LAB_003ddd13:
  if (bVar1 != false) {
    uVar2 = uVar9;
    if (uVar9 == 0) {
      if (uVar6 == 1) {
        uVar2 = 2;
      }
      else if (uVar6 == 8) {
        uVar2 = 0x100;
      }
      else if (uVar6 == 4) {
        uVar2 = 0x10;
      }
      else {
        uVar2 = 0;
      }
    }
    local_58 = (ulong)uVar4;
    local_60 = uVar4;
    pOVar3 = (ON_WindowsBITMAPINFO *)onmalloc(local_58 + (long)(int)uVar2 * 4 + 0x2c);
    this_00 = local_38;
    if (pOVar3 != (ON_WindowsBITMAPINFO *)0x0) {
      (pOVar3->bmiHeader).biSize = 0;
      (pOVar3->bmiHeader).biWidth = 0;
      (pOVar3->bmiHeader).biHeight = 0;
      (pOVar3->bmiHeader).biPlanes = 0;
      (pOVar3->bmiHeader).biBitCount = 0;
      (pOVar3->bmiHeader).biYPelsPerMeter = 0;
      (pOVar3->bmiHeader).biClrUsed = 0;
      *(undefined8 *)&(pOVar3->bmiHeader).biClrImportant = 0;
      (pOVar3->bmiHeader).biCompression = 0;
      (pOVar3->bmiHeader).biSizeImage = 0;
      (pOVar3->bmiHeader).biXPelsPerMeter = 0;
      (pOVar3->bmiHeader).biYPelsPerMeter = 0;
      (pOVar3->bmiHeader).biSize = 0x28;
    }
    local_40->m_bmi = pOVar3;
    if (pOVar3 == (ON_WindowsBITMAPINFO *)0x0) {
      bVar1 = false;
    }
    else {
      local_40->m_bFreeBMI = 1;
      (pOVar3->bmiHeader).biSize = 0x28;
      (pOVar3->bmiHeader).biWidth = uVar11;
      (pOVar3->bmiHeader).biHeight = local_70;
      (pOVar3->bmiHeader).biPlanes = (unsigned_short)local_68;
      (pOVar3->bmiHeader).biBitCount = uVar6;
      (pOVar3->bmiHeader).biCompression = local_64;
      (pOVar3->bmiHeader).biSizeImage = local_60;
      (pOVar3->bmiHeader).biXPelsPerMeter = iVar5;
      (pOVar3->bmiHeader).biYPelsPerMeter = uVar10;
      (pOVar3->bmiHeader).biClrUsed = uVar9;
      (pOVar3->bmiHeader).biClrImportant = uVar7;
      if (uVar9 == 0) {
        if (uVar6 == 1) {
          uVar9 = 2;
        }
        else if (uVar6 == 8) {
          uVar9 = 0x100;
        }
        else if (uVar6 == 4) {
          uVar9 = 0x10;
        }
        else {
          uVar9 = 0;
        }
      }
      lVar8 = (long)(int)uVar9;
      if (local_60 != 0) {
        local_40->m_bits = &pOVar3->bmiColors[lVar8].rgbBlue;
      }
      local_48 = 0;
      bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(local_38,&local_48);
      if (bVar1) {
        if ((local_48 == lVar8 * 4) || (local_48 == local_58 + lVar8 * 4)) {
          bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                            (this_00,local_48,local_40->m_bmi->bmiColors,&local_71);
          if (local_60 == 0) {
            return bVar1;
          }
          if (!bVar1) {
            return bVar1;
          }
          if (local_48 != lVar8 * 4) {
            return bVar1;
          }
          local_48 = 0;
          bVar1 = ON_BinaryArchive::ReadCompressedBufferSize(this_00,&local_48);
          if (!bVar1) {
            return bVar1;
          }
          if (local_48 == local_58) {
            bVar1 = ON_BinaryArchive::ReadCompressedBuffer
                              (this_00,local_48,local_40->m_bmi->bmiColors + lVar8,&local_71);
            return bVar1;
          }
          sFormat = "ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n";
          iVar5 = 0x3b4;
        }
        else {
          sFormat = "ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n";
          iVar5 = 0x3bc;
        }
        bVar1 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bitmap.cpp"
                   ,iVar5,"",sFormat);
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_WindowsBitmap::ReadCompressed( ON_BinaryArchive& file )
{
  Internal_Destroy();

  bool bFailedCRC = false;
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif
  memset(&bmiHeader,0,sizeof(bmiHeader));
  int i;
  short s;
  bool rc;

  for(;;)
  {
    i = 0;
    s = 0;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSize = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biWidth = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biHeight = i;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biPlanes = s;
    rc = file.ReadShort(&s); if (!rc) break; bmiHeader.biBitCount = s;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biCompression = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biSizeImage = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biXPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biYPelsPerMeter = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrUsed = i;
    rc = file.ReadInt(&i);   if (!rc) break; bmiHeader.biClrImportant = i;
    break;
  }


  if ( rc ) 
  {
    bmiHeader.biSize = sizeof(bmiHeader);
    const size_t sizeof_palette = ON_WindowsBitmapHelper_SizeofPalette(bmiHeader.biClrUsed, bmiHeader.biBitCount );
    const size_t sizeof_image   = bmiHeader.biSizeImage;
    m_bmi = ON_WindowsBitmapHelper_AllocBMI(sizeof_palette,sizeof_image);
    if ( !m_bmi )
    {
      rc = false;
    }
    else 
    {
      m_bFreeBMI = 1;
      m_bmi->bmiHeader = bmiHeader;
      m_bmi->bmiHeader.biSize = sizeof(m_bmi->bmiHeader);
      const int color_count = ON_WindowsBitmapHelper_PaletteColorCount(bmiHeader.biClrUsed, bmiHeader.biBitCount );
      if ( sizeof_image > 0 )
        m_bits = (unsigned char*)&m_bmi->bmiColors[color_count];
      size_t sizeof_buffer = 0;
      rc = file.ReadCompressedBufferSize( &sizeof_buffer );
      if (rc)
      {
        const size_t sizeof_colors = color_count*sizeof(*m_bmi->bmiColors);
        if (    sizeof_buffer == sizeof_colors
             || sizeof_buffer == sizeof_colors + sizeof_image
           ) 
        {
          // palette and image bits are compressed into one or two chunks
          rc = file.ReadCompressedBuffer( sizeof_buffer, m_bmi->bmiColors, &bFailedCRC );
          if ( rc && sizeof_image > 0 && sizeof_buffer == sizeof_colors )
          {
            // 28 July 2003
            //     Added support for reading non-contiguous bitmaps
            sizeof_buffer = 0;
            rc = file.ReadCompressedBufferSize( &sizeof_buffer );
            if (rc)
            {
              if ( sizeof_buffer == sizeof_image )
              {
                // image bits are compressed into a separatechunk
                rc = file.ReadCompressedBuffer( sizeof_buffer, &m_bmi->bmiColors[color_count], &bFailedCRC );
              }
              else
              {
                ON_ERROR("ON_WindowsBitmap::ReadCompressed() image bits buffer size mismatch\n");
                rc = false;
              }
            }
          }
        }
        else
        {
          ON_ERROR("ON_WindowsBitmap::ReadCompressed() buffer size mismatch\n");
          rc = false;
        }
      }
    }
  }
  return rc;
}